

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# navigation.cpp
# Opt level: O3

void __thiscall despot::Navigation::PrintMDPPolicy(Navigation *this)

{
  int iVar1;
  ostream *poVar2;
  long lVar3;
  long lVar4;
  
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"MDP (Start)",0xb);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x30);
  std::ostream::put(-0x30);
  std::ostream::flush();
  iVar1 = (**(code **)(*(long *)this + 0xd0))(this);
  if (0 < iVar1) {
    lVar4 = 0;
    lVar3 = 0;
    do {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"State ",6);
      poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,(int)lVar3);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,"; Action = ",0xb);
      poVar2 = (ostream *)
               std::ostream::operator<<
                         ((ostream *)poVar2,*(int *)(*(long *)&this->field_0x10 + lVar4));
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,"; Reward = ",0xb);
      poVar2 = std::ostream::_M_insert<double>(*(double *)(*(long *)&this->field_0x10 + 8 + lVar4));
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
      std::ostream::put((char)poVar2);
      std::ostream::flush();
      (**(code **)(*(long *)this + 0x88))
                (this,(this->states_).
                      super__Vector_base<despot::NavigationState_*,_std::allocator<despot::NavigationState_*>_>
                      ._M_impl.super__Vector_impl_data._M_start[lVar3],&std::cout);
      lVar3 = lVar3 + 1;
      iVar1 = (**(code **)(*(long *)this + 0xd0))(this);
      lVar4 = lVar4 + 0x10;
    } while (lVar3 < iVar1);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"MDP (End)",9);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x30);
  std::ostream::put(-0x30);
  std::ostream::flush();
  return;
}

Assistant:

void Navigation::PrintMDPPolicy() const {
	cout << "MDP (Start)" << endl;
	for (int s = 0; s < NumStates(); s++) {
		cout << "State " << s << "; Action = " << policy_[s].action
			<< "; Reward = " << policy_[s].value << endl;
		PrintState(*(states_[s]));
	}
	cout << "MDP (End)" << endl;
}